

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

NanoVDBMediumProvider *
pbrt::NanoVDBMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  NanoVDBMediumProvider *pNVar4;
  Float temperatureCutoff;
  Float temperatureScale;
  Float LeScale;
  GridHandle<pbrt::NanoVDBBuffer> temperatureGrid;
  GridHandle<pbrt::NanoVDBBuffer> densityGrid;
  Bounds3f bounds;
  string filename;
  allocator<char> local_121;
  undefined1 local_120 [8];
  NanoVDBBuffer local_118;
  Float local_fc;
  Float local_f8;
  undefined4 uStack_f4;
  undefined8 uStack_f0;
  Float local_e4;
  Tuple3<pbrt::Point3,_float> local_e0;
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  double local_90;
  double local_88;
  string local_80;
  polymorphic_allocator<std::byte> local_60;
  string local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_60.memoryResource = alloc.memoryResource;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,"filename",(allocator<char> *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_120,"",(allocator<char> *)&local_e0);
  ParameterDictionary::GetOneString
            ((string *)local_b0,parameters,(string *)local_d0,(string *)local_120);
  ResolveFilename(&local_58,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_d0);
  if (local_58._M_string_length == 0) {
    ErrorExit(loc,"Must supply \"filename\" to \"nanovdb\" medium.");
  }
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle((GridHandle<pbrt::NanoVDBBuffer> *)local_b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_120,"density",(allocator<char> *)&local_80);
  readGrid<pbrt::NanoVDBBuffer>
            ((GridHandle<pbrt::NanoVDBBuffer> *)local_d0,&local_58,(string *)local_120,loc,alloc);
  NanoVDBBuffer::operator=((NanoVDBBuffer *)(local_b0 + 8),(NanoVDBBuffer *)(local_d0 + 8));
  nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle((GridHandle<pbrt::NanoVDBBuffer> *)local_d0)
  ;
  std::__cxx11::string::~string((string *)local_120);
  lVar3 = (**(code **)(local_b0._0_8_ + 0x10))(local_b0);
  if (lVar3 != 0) {
    lVar3 = 0;
    if (*(int *)(local_b0._24_8_ + 0x274) == 1) {
      lVar3 = local_b0._24_8_;
    }
    local_90 = *(double *)(lVar3 + 0x238);
    local_38 = *(undefined8 *)(lVar3 + 0x228);
    uStack_30 = *(undefined8 *)(lVar3 + 0x230);
    uStack_f0 = *(undefined8 *)(lVar3 + 0x248);
    local_88 = *(double *)(lVar3 + 0x250);
    local_f8 = (Float)*(undefined8 *)(lVar3 + 0x240);
    uStack_f4 = (undefined4)((ulong)*(undefined8 *)(lVar3 + 0x240) >> 0x20);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"temperature",(allocator<char> *)&local_e0);
    readGrid<pbrt::NanoVDBBuffer>
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_120,&local_58,&local_80,loc,alloc);
    NanoVDBBuffer::operator=((NanoVDBBuffer *)(local_d0 + 8),&local_118);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_120);
    std::__cxx11::string::~string((string *)&local_80);
    auVar2._8_8_ = uStack_30;
    auVar2._0_8_ = local_38;
    auVar1 = vcvtpd2ps_avx(auVar2);
    local_118.alloc.memoryResource._0_4_ = (float)local_90;
    local_120 = (undefined1  [8])vmovlps_avx(auVar1);
    auVar1._4_4_ = uStack_f4;
    auVar1._0_4_ = local_f8;
    auVar1._8_8_ = uStack_f0;
    auVar1 = vcvtpd2ps_avx(auVar1);
    local_e0.z = (float)local_88;
    local_e0._0_8_ = vmovlps_avx(auVar1);
    Bounds3<float>::Bounds3
              ((Bounds3<float> *)&local_80,(Point3<float> *)local_120,(Point3<float> *)&local_e0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"LeScale",(allocator<char> *)&local_fc);
    local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_120,1.0);
    std::__cxx11::string::~string((string *)local_120);
    local_e0.x = local_f8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"temperaturecutoff",(allocator<char> *)&local_e4);
    local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_120,0.0);
    std::__cxx11::string::~string((string *)local_120);
    local_fc = local_f8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_120,"temperaturescale",&local_121);
    local_f8 = ParameterDictionary::GetOneFloat(parameters,(string *)local_120,1.0);
    std::__cxx11::string::~string((string *)local_120);
    local_e4 = local_f8;
    pNVar4 = pstd::pmr::polymorphic_allocator<std::byte>::
             new_object<pbrt::NanoVDBMediumProvider,pbrt::Bounds3<float>&,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,nanovdb::GridHandle<pbrt::NanoVDBBuffer>,float&,float&,float&>
                       (&local_60,(Bounds3<float> *)&local_80,
                        (GridHandle<pbrt::NanoVDBBuffer> *)local_b0,
                        (GridHandle<pbrt::NanoVDBBuffer> *)local_d0,&local_e0.x,&local_fc,
                        (float *)&local_e4);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_d0);
    nanovdb::GridHandle<pbrt::NanoVDBBuffer>::~GridHandle
              ((GridHandle<pbrt::NanoVDBBuffer> *)local_b0);
    std::__cxx11::string::~string((string *)&local_58);
    return pNVar4;
  }
  ErrorExit<std::__cxx11::string&>(loc,"%s: didn\'t find \"density\" grid.",&local_58);
}

Assistant:

NanoVDBMediumProvider *NanoVDBMediumProvider::Create(
    const ParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    std::string filename = ResolveFilename(parameters.GetOneString("filename", ""));
    if (filename.empty())
        ErrorExit(loc, "Must supply \"filename\" to \"nanovdb\" medium.");

    nanovdb::GridHandle<NanoVDBBuffer> densityGrid;
    nanovdb::BBox<nanovdb::Vec3R> bbox;
    densityGrid = readGrid<NanoVDBBuffer>(filename, "density", loc, alloc);
    if (!densityGrid)
        ErrorExit(loc, "%s: didn't find \"density\" grid.", filename);

    bbox = densityGrid.grid<float>()->worldBBox();

    nanovdb::GridHandle<NanoVDBBuffer> temperatureGrid;
    temperatureGrid = readGrid<NanoVDBBuffer>(filename, "temperature", loc, alloc);

    Bounds3f bounds(Point3f(bbox.min()[0], bbox.min()[1], bbox.min()[2]),
                    Point3f(bbox.max()[0], bbox.max()[1], bbox.max()[2]));

    Float LeScale = parameters.GetOneFloat("LeScale", 1.f);
    Float temperatureCutoff = parameters.GetOneFloat("temperaturecutoff", 0.f);
    Float temperatureScale = parameters.GetOneFloat("temperaturescale", 1.f);

    return alloc.new_object<NanoVDBMediumProvider>(bounds, std::move(densityGrid),
                                                   std::move(temperatureGrid), LeScale,
                                                   temperatureCutoff, temperatureScale);
}